

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmGhsMultiTargetGenerator::WriteSources(cmGhsMultiTargetGenerator *this,ostream *fout_proj)

{
  pointer *this_00;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *pvVar1;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  cmGeneratorTarget *this_02;
  cmMakefile *pcVar2;
  cmSourceFile *this_03;
  cmLocalGenerator *lg;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  __first;
  iterator iVar3;
  bool bVar4;
  byte bVar5;
  __type _Var6;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *__x;
  size_type __n;
  size_type sVar7;
  reference pbVar8;
  reference pvVar9;
  reference __k;
  iterator iVar10;
  iterator iVar11;
  ulong uVar12;
  string *psVar13;
  cmGeneratedFileStream *this_04;
  cmGlobalGhsMultiGenerator *this_05;
  ostream *poVar14;
  mapped_type *pmVar15;
  reference ppcVar16;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  __middle;
  iterator __last;
  reference ppcVar17;
  cmCustomCommand *pcVar18;
  cmSourceFileLocation *pcVar19;
  reference ppcVar20;
  value_type *__x_00;
  cmSourceFile *sourceFile;
  bool local_e0a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d50;
  cmGeneratedFileStream *f_2;
  iterator __end1_5;
  iterator __begin1_5;
  vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> *__range1_5;
  cmGeneratedFileStream f_1;
  int local_a00;
  char local_9f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  cmAlphaNum local_9d8;
  cmAlphaNum local_9a8;
  undefined1 local_978 [8];
  string fname_1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_938;
  string local_910;
  undefined1 local_8f0 [8];
  cmCustomCommandGenerator ccg;
  cmCustomCommand *cc;
  cmSourceFile **sf_2;
  iterator __end4;
  iterator __begin4;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range4;
  undefined1 local_760 [8];
  string fext;
  int cmdcount;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_6f8;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_6f0;
  iterator sf_1;
  undefined1 local_6c8 [8];
  string message;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  string objectName;
  string local_668;
  allocator<char> local_641;
  string local_640;
  allocator<char> local_619;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  string local_580;
  byte local_559;
  string local_558;
  string local_538 [8];
  string comment;
  string fname;
  bool compile;
  cmSourceFile *si;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  cmGeneratedFileStream *f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  cmAlphaNum local_4a0;
  cmAlphaNum local_470;
  undefined1 local_440 [8];
  string fpath;
  cmAlphaNum local_3f0;
  undefined1 local_3c0 [8];
  string lpath;
  string gname;
  string local_378;
  allocator<char> local_351;
  string local_350;
  string *local_330;
  byte local_321;
  ostream *poStack_320;
  bool useProjectFile;
  ostream *fout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *sg;
  iterator __end1_4;
  iterator __begin1_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_4;
  vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> gfiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n_2;
  iterator __end1_2;
  iterator __begin1_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  _Self local_280;
  iterator n_1;
  string gn_2;
  _Self local_250;
  iterator n;
  string *gn_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupFilesList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  iterator local_138;
  size_type local_130;
  undefined1 local_128 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  standardGroups;
  string gn;
  cmSourceGroup *sourceGroup;
  cmSourceFile *sf;
  iterator __end1;
  iterator __begin1;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupNames;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  groupFiles;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  undefined1 local_30 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  ostream *fout_proj_local;
  cmGhsMultiTargetGenerator *this_local;
  
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)fout_proj;
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_30);
  cmGeneratorTarget::GetSourceFiles
            (this->GeneratorTarget,
             (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_30,&this->ConfigName);
  __x = cmMakefile::GetSourceGroups(this->Makefile);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
            ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
             &groupFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,__x);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
         *)&groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range1);
  __end1 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_30);
  sf = (cmSourceFile *)
       std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                 ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_30);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                     *)&sf), bVar4) {
    ppcVar16 = __gnu_cxx::
               __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
               ::operator*(&__end1);
    sourceGroup = (cmSourceGroup *)*ppcVar16;
    pcVar2 = this->Makefile;
    psVar13 = cmSourceFile::ResolveFullPath((cmSourceFile *)sourceGroup,(string *)0x0,(string *)0x0)
    ;
    gn.field_2._8_8_ =
         cmMakefile::FindSourceGroup
                   (pcVar2,psVar13,
                    (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
                    &groupFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
    psVar13 = cmSourceGroup::GetFullName_abi_cxx11_((cmSourceGroup *)gn.field_2._8_8_);
    std::__cxx11::string::string((string *)&stack0xffffffffffffff00,(string *)psVar13);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                            *)&groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (key_type *)&stack0xffffffffffffff00);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
              (pmVar15,(value_type *)&sourceGroup);
    standardGroups.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                            *)&__range1,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&stack0xffffffffffffff00,__x_00);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
    __gnu_cxx::
    __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
    ::operator++(&__end1);
  }
  groupFilesList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"CMake Rules",
             (allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,"Header Files",
             (allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,"Source Files",
             (allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_198,"Object Files",
             (allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"Object Libraries",
             (allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"Resources",
             (allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  groupFilesList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
  local_138 = &local_1f8;
  local_130 = 6;
  this_00 = &groupFilesList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_00);
  __l._M_len = local_130;
  __l._M_array = local_138;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_128,__l,(allocator_type *)this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&groupFilesList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_d50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138;
  do {
    local_d50 = local_d50 + -1;
    std::__cxx11::string::~string((string *)local_d50);
  } while (local_d50 != &local_1f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  __n = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
        ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                *)&groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&__range1_1 + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i,__n,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&__range1_1 + 7));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&__range1_1 + 7));
  __range1_1._0_4_ = 0;
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_128);
  gn_1 = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_128);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&gn_1), bVar4) {
    n._M_node = (_Base_ptr)
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
    local_250._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,(key_type *)n._M_node);
    gn_2.field_2._8_8_ =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1);
    bVar4 = std::operator!=(&local_250,(_Self *)((long)&gn_2.field_2 + 8));
    if (bVar4) {
      pbVar8 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_250);
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i,(long)(int)__range1_1);
      std::__cxx11::string::operator=((string *)pvVar9,(string *)pbVar8);
      __range1_1._0_4_ = (int)__range1_1 + 1;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1,(key_type *)n._M_node);
    }
    else if ((this->TagType == CUSTOM_TARGET) &&
            (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)n._M_node,"CMake Rules"), bVar4)) {
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i,sVar7 + 1);
      iVar3 = n;
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i,(long)(int)__range1_1);
      std::__cxx11::string::operator=((string *)pvVar9,(string *)iVar3._M_node);
      __range1_1._0_4_ = (int)__range1_1 + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::__cxx11::string::string((string *)&n_1);
  local_280._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1,(key_type *)&n_1);
  __range1_2 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range1);
  bVar4 = std::operator!=(&local_280,(_Self *)&__range1_2);
  if (bVar4) {
    pbVar8 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_280);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&i);
    std::__cxx11::string::operator=((string *)pvVar9,(string *)pbVar8);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1,(key_type *)&n_1);
  }
  std::__cxx11::string::~string((string *)&n_1);
  __end1_2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
  n_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1);
  while (bVar4 = std::operator!=(&__end1_2,(_Self *)&n_2), bVar4) {
    pbVar8 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1_2);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i,(long)(int)__range1_1);
    std::__cxx11::string::operator=((string *)pvVar9,(string *)pbVar8);
    __range1_1._0_4_ = (int)__range1_1 + 1;
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_2);
  }
  __end1_3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i);
  n_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&n_3), bVar4) {
    __k = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end1_3);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                            *)&groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count,__k);
    iVar10 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin(pmVar15);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                            *)&groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count,__k);
    iVar11 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end(pmVar15);
    std::
    sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>
              (iVar10._M_current,iVar11._M_current);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_3);
  }
  std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>::vector
            ((vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> *)
             &__range1_4);
  __end1_4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i);
  sg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i);
  do {
    bVar4 = __gnu_cxx::operator!=
                      (&__end1_4,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&sg);
    if (!bVar4) {
      __end1_5 = std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>::
                 begin((vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> *)
                       &__range1_4);
      f_2 = (cmGeneratedFileStream *)
            std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>::end
                      ((vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> *)
                       &__range1_4);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end1_5,
                                (__normal_iterator<cmGeneratedFileStream_**,_std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>_>
                                 *)&f_2), bVar4) {
        ppcVar20 = __gnu_cxx::
                   __normal_iterator<cmGeneratedFileStream_**,_std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>_>
                   ::operator*(&__end1_5);
        cmGeneratedFileStream::Close(*ppcVar20);
        __gnu_cxx::
        __normal_iterator<cmGeneratedFileStream_**,_std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>_>
        ::operator++(&__end1_5);
      }
      std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>::~vector
                ((vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> *)
                 &__range1_4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
              *)&groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector
                ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
                 &groupFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_30);
      return;
    }
    fout = (ostream *)
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1_4);
    this_02 = this->GeneratorTarget;
    std::allocator<char>::allocator();
    gname.field_2._M_local_buf[0xe] = '\0';
    gname.field_2._M_local_buf[0xd] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"GHS_NO_SOURCE_GROUP_FILE",&local_351);
    local_330 = (string *)cmGeneratorTarget::GetProperty(this_02,&local_350);
    bVar4 = cmIsOn((cmValue)local_330);
    local_e0a = true;
    if (!bVar4) {
      pcVar2 = this->Makefile;
      std::allocator<char>::allocator();
      gname.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,"CMAKE_GHS_NO_SOURCE_GROUP_FILE",
                 (allocator<char> *)(gname.field_2._M_local_buf + 0xf));
      gname.field_2._M_local_buf[0xd] = '\x01';
      local_e0a = cmMakefile::IsOn(pcVar2,&local_378);
    }
    if ((gname.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_378);
    }
    if ((gname.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(gname.field_2._M_local_buf + 0xf));
    }
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator(&local_351);
    local_321 = local_e0a;
    if ((local_e0a == false) && (uVar12 = std::__cxx11::string::empty(), (uVar12 & 1) == 0)) {
      std::__cxx11::string::string((string *)(lpath.field_2._M_local_buf + 8),(string *)fout);
      cmsys::SystemTools::ReplaceString((string *)((long)&lpath.field_2 + 8),"\\","_");
      cmAlphaNum::cmAlphaNum(&local_3f0,(string *)((long)&lpath.field_2 + 8));
      cmAlphaNum::cmAlphaNum
                ((cmAlphaNum *)((long)&fpath.field_2 + 8),cmGlobalGhsMultiGenerator::FILE_EXTENSION)
      ;
      cmStrCat<>((string *)local_3c0,&local_3f0,(cmAlphaNum *)((long)&fpath.field_2 + 8));
      psVar13 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                          (&this->LocalGenerator->super_cmLocalGenerator);
      cmAlphaNum::cmAlphaNum(&local_470,psVar13);
      cmAlphaNum::cmAlphaNum(&local_4a0,'/');
      (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
                (&local_4c0,this->LocalGenerator,this->GeneratorTarget);
      f._7_1_ = 0x2f;
      cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
                ((string *)local_440,&local_470,&local_4a0,&local_4c0,(char *)((long)&f + 7),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
      std::__cxx11::string::~string((string *)&local_4c0);
      this_04 = (cmGeneratedFileStream *)operator_new(0x268);
      cmGeneratedFileStream::cmGeneratedFileStream(this_04,(string *)local_440,false,None);
      __range3 = (mapped_type *)this_04;
      cmGeneratedFileStream::SetCopyIfDifferent(this_04,true);
      std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>::push_back
                ((vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> *)
                 &__range1_4,(value_type *)&__range3);
      poStack_320 = (ostream *)__range3;
      this_05 = GetGlobalGenerator(this);
      cmGlobalGhsMultiGenerator::WriteFileHeader(this_05,(ostream *)__range3);
      GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)__range3);
      poVar14 = std::operator<<((ostream *)
                                sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (string *)local_3c0);
      std::operator<<(poVar14," ");
      GhsMultiGpj::WriteGpjTag
                (SUBPROJECT,
                 (ostream *)
                 sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_440);
      std::__cxx11::string::~string((string *)local_3c0);
      std::__cxx11::string::~string((string *)(lpath.field_2._M_local_buf + 8));
    }
    else {
      poStack_320 = (ostream *)
                    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    if ((local_321 & 1) == 0) {
      uVar12 = std::__cxx11::string::empty();
      if ((uVar12 & 1) != 0) {
        std::operator<<(poStack_320,"{comment} Others\n");
      }
    }
    else {
      uVar12 = std::__cxx11::string::empty();
      if ((uVar12 & 1) == 0) {
        poVar14 = std::operator<<(poStack_320,"{comment} ");
        poVar14 = std::operator<<(poVar14,(string *)fout);
        std::operator<<(poVar14,'\n');
      }
      else {
        poVar14 = std::operator<<(poStack_320,"{comment} Others");
        std::operator<<(poVar14,'\n');
      }
    }
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            fout,"CMake Rules");
    if (bVar4) {
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                              *)&groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (key_type *)fout);
      __end3 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin(pmVar15);
      si = (cmSourceFile *)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end(pmVar15);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                         *)&si), bVar4) {
        ppcVar16 = __gnu_cxx::
                   __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                   ::operator*(&__end3);
        this_03 = *ppcVar16;
        psVar13 = cmSourceFile::GetFullPath_abi_cxx11_(this_03);
        std::__cxx11::string::string((string *)(comment.field_2._M_local_buf + 8),(string *)psVar13)
        ;
        cmSystemTools::ConvertToOutputSlashes((string *)((long)&comment.field_2 + 8));
        std::__cxx11::string::string(local_538);
        local_559 = 0;
        if (this->TagType == CUSTOM_TARGET) {
          cmSourceFile::GetLanguage_abi_cxx11_(&local_558,this_03);
          local_559 = 1;
          bVar5 = std::__cxx11::string::empty();
          bVar4 = true;
          if ((bVar5 & 1) != 0) goto LAB_005368c2;
        }
        else {
LAB_005368c2:
          pcVar18 = cmSourceFile::GetCustomCommand(this_03);
          bVar4 = pcVar18 != (cmCustomCommand *)0x0;
        }
        if ((local_559 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_558);
        }
        if (bVar4) {
          std::__cxx11::string::operator=(local_538,"{comment} ");
        }
        fname.field_2._M_local_buf[0xf] = !bVar4;
        poVar14 = std::operator<<(poStack_320,local_538);
        poVar14 = std::operator<<(poVar14,(string *)(comment.field_2._M_local_buf + 8));
        WriteObjectLangOverride_abi_cxx11_
                  (&local_580,(cmGhsMultiTargetGenerator *)this_03,sourceFile);
        poVar14 = std::operator<<(poVar14,(string *)&local_580);
        std::operator<<(poVar14,'\n');
        std::__cxx11::string::~string((string *)&local_580);
        poVar14 = poStack_320;
        if ((bool)fname.field_2._M_local_buf[0xf]) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5a0,"INCLUDE_DIRECTORIES",&local_5a1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"-I",&local_5c9);
          WriteSourceProperty(this,poVar14,this_03,&local_5a0,&local_5c8);
          std::__cxx11::string::~string((string *)&local_5c8);
          std::allocator<char>::~allocator(&local_5c9);
          std::__cxx11::string::~string((string *)&local_5a0);
          std::allocator<char>::~allocator(&local_5a1);
          poVar14 = poStack_320;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5f0,"COMPILE_DEFINITIONS",&local_5f1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"-D",&local_619);
          WriteSourceProperty(this,poVar14,this_03,&local_5f0,&local_618);
          std::__cxx11::string::~string((string *)&local_618);
          std::allocator<char>::~allocator(&local_619);
          std::__cxx11::string::~string((string *)&local_5f0);
          std::allocator<char>::~allocator(&local_5f1);
          poVar14 = poStack_320;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_640,"COMPILE_OPTIONS",&local_641);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_668,"",
                     (allocator<char> *)(objectName.field_2._M_local_buf + 0xf));
          WriteSourceProperty(this,poVar14,this_03,&local_640,&local_668);
          std::__cxx11::string::~string((string *)&local_668);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(objectName.field_2._M_local_buf + 0xf));
          std::__cxx11::string::~string((string *)&local_640);
          std::allocator<char>::~allocator(&local_641);
          psVar13 = cmGeneratorTarget::GetObjectName_abi_cxx11_(this->GeneratorTarget,this_03);
          std::__cxx11::string::string
                    ((string *)
                     &customCommands.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar13);
          uVar12 = std::__cxx11::string::empty();
          if (((uVar12 & 1) == 0) &&
             (bVar4 = cmGeneratorTarget::HasExplicitObjectName(this->GeneratorTarget,this_03), bVar4
             )) {
            poVar14 = std::operator<<(poStack_320,"    -o ");
            poVar14 = std::operator<<(poVar14,(string *)
                                              &customCommands.
                                               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::operator<<(poVar14,'\n');
          }
          std::__cxx11::string::~string
                    ((string *)
                     &customCommands.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::__cxx11::string::~string(local_538);
        std::__cxx11::string::~string((string *)(comment.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
        ::operator++(&__end3);
      }
    }
    else {
      pvVar1 = (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
               ((long)&message.field_2 + 8);
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector(pvVar1);
      bVar4 = ComputeCustomCommandOrder(this,pvVar1);
      if (bVar4) {
        psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf_1,
                       "The custom commands for target [",psVar13);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_6c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf_1,
                       "] had a cycle.\n");
        std::__cxx11::string::~string((string *)&sf_1);
        cmSystemTools::Error((string *)local_6c8);
        std::__cxx11::string::~string((string *)local_6c8);
      }
      else {
        local_6f0._M_current =
             (cmSourceFile **)
             std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        ((long)&message.field_2 + 8));
        while( true ) {
          local_6f8._M_current =
               (cmSourceFile **)
               std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                         ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                          ((long)&message.field_2 + 8));
          bVar4 = __gnu_cxx::operator!=(&local_6f0,&local_6f8);
          if (!bVar4) break;
          ppcVar17 = __gnu_cxx::
                     __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                     ::operator*(&local_6f0);
          pcVar19 = cmSourceFile::GetLocation(*ppcVar17);
          psVar13 = cmSourceFileLocation::GetName_abi_cxx11_(pcVar19);
          std::operator+(&local_718,&this->Name,".rule");
          _Var6 = std::operator==(psVar13,&local_718);
          std::__cxx11::string::~string((string *)&local_718);
          __first._M_current = local_6f0._M_current;
          if (_Var6) {
            __middle = __gnu_cxx::
                       __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                       ::operator+(&local_6f0,1);
            __last = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                               ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                 *)((long)&message.field_2 + 8));
            std::_V2::
            rotate<__gnu_cxx::__normal_iterator<cmSourceFile_const**,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>>
                      (__first,__middle,
                       (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                        )__last._M_current);
            break;
          }
          __gnu_cxx::
          __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
          ::operator++(&local_6f0);
        }
        fext.field_2._12_4_ = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_760,".sh",(allocator<char> *)((long)&__range4 + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
        pvVar1 = (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                 ((long)&message.field_2 + 8);
        __end4 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                           (pvVar1);
        sf_2 = (cmSourceFile **)
               std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end(pvVar1)
        ;
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                           *)&sf_2), bVar4) {
          ppcVar17 = __gnu_cxx::
                     __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                     ::operator*(&__end4);
          pcVar18 = cmSourceFile::GetCustomCommand(*ppcVar17);
          ccg.ComputeInternalDepfile._M_invoker = (_Invoker_type)pcVar18;
          std::__cxx11::string::string((string *)&local_910,(string *)&this->ConfigName);
          lg = &this->LocalGenerator->super_cmLocalGenerator;
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::optional(&local_938);
          this_01 = (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     *)((long)&fname_1.field_2 + 8);
          std::
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function(this_01);
          cmCustomCommandGenerator::cmCustomCommandGenerator
                    ((cmCustomCommandGenerator *)local_8f0,pcVar18,&local_910,lg,true,&local_938,
                     this_01);
          std::
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)((long)&fname_1.field_2 + 8));
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional(&local_938);
          std::__cxx11::string::~string((string *)&local_910);
          psVar13 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                              (&this->LocalGenerator->super_cmLocalGenerator);
          cmAlphaNum::cmAlphaNum(&local_9a8,psVar13);
          cmAlphaNum::cmAlphaNum(&local_9d8,'/');
          (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
                    (&local_9f8,this->LocalGenerator,this->GeneratorTarget);
          local_9f9 = '/';
          local_a00 = fext.field_2._12_4_;
          f_1._615_1_ = 0x5f;
          fext.field_2._12_4_ = fext.field_2._12_4_ + 1;
          pcVar19 = cmSourceFile::GetLocation(*ppcVar17);
          psVar13 = cmSourceFileLocation::GetName_abi_cxx11_(pcVar19);
          cmStrCat<std::__cxx11::string,char,std::__cxx11::string,char[4],int,char,std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_978,&local_9a8,&local_9d8,&local_9f8,&local_9f9,&this->Name,
                     (char (*) [4])"_cc",&local_a00,&f_1.field_0x267,psVar13,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_760)
          ;
          std::__cxx11::string::~string((string *)&local_9f8);
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)&__range1_5,(string *)local_978,false,None);
          cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)&__range1_5,true);
          WriteCustomCommandsHelper
                    (this,(ostream *)&__range1_5,(cmCustomCommandGenerator *)local_8f0);
          cmGeneratedFileStream::Close((cmGeneratedFileStream *)&__range1_5);
          WriteCustomCommandLine
                    (this,poStack_320,(string *)local_978,(cmCustomCommandGenerator *)local_8f0);
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&__range1_5);
          std::__cxx11::string::~string((string *)local_978);
          cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_8f0)
          ;
          __gnu_cxx::
          __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
          ::operator++(&__end4);
        }
        std::__cxx11::string::~string((string *)local_760);
      }
      if (this->TagType == CUSTOM_TARGET) {
        WriteBuildEvents(this,poStack_320);
      }
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                 ((long)&message.field_2 + 8));
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_4);
  } while( true );
}

Assistant:

void cmGhsMultiTargetGenerator::WriteSources(std::ostream& fout_proj)
{
  /* vector of all sources for this target */
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);

  /* vector of all groups defined for this target
   * -- but the vector is not expanded with sub groups or in any useful order
   */
  std::vector<cmSourceGroup> sourceGroups = this->Makefile->GetSourceGroups();

  /* for each source file assign it to its group */
  std::map<std::string, std::vector<cmSourceFile*>> groupFiles;
  std::set<std::string> groupNames;
  for (cmSourceFile* sf : sources) {
    cmSourceGroup* sourceGroup =
      this->Makefile->FindSourceGroup(sf->ResolveFullPath(), sourceGroups);
    std::string gn = sourceGroup->GetFullName();
    groupFiles[gn].push_back(sf);
    groupNames.insert(std::move(gn));
  }

  /* list of known groups and the order they are displayed in a project file */
  const std::vector<std::string> standardGroups = {
    "CMake Rules",  "Header Files",     "Source Files",
    "Object Files", "Object Libraries", "Resources"
  };

  /* list of groups in the order they are displayed in a project file*/
  std::vector<std::string> groupFilesList(groupFiles.size());

  /* put the groups in the order they should be listed
   * - standard groups first, and then everything else
   *   in the order used by std::map.
   */
  int i = 0;
  for (const std::string& gn : standardGroups) {
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList[i] = *n;
      i += 1;
      groupNames.erase(gn);
    } else if (this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
               gn == "CMake Rules") {
      /* make sure that rules folder always exists in case of custom targets
       * that have no custom commands except for pre or post build events.
       */
      groupFilesList.resize(groupFilesList.size() + 1);
      groupFilesList[i] = gn;
      i += 1;
    }
  }

  { /* catch-all group - is last item */
    std::string gn;
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList.back() = *n;
      groupNames.erase(gn);
    }
  }

  for (const auto& n : groupNames) {
    groupFilesList[i] = n;
    i += 1;
  }

  /* sort the files within each group */
  for (auto& n : groupFilesList) {
    std::sort(groupFiles[n].begin(), groupFiles[n].end(),
              [](cmSourceFile* l, cmSourceFile* r) {
                return l->ResolveFullPath() < r->ResolveFullPath();
              });
  }

  /* list of open project files */
  std::vector<cmGeneratedFileStream*> gfiles;

  /* write files into the proper project file
   * -- groups go into main project file
   *    unless NO_SOURCE_GROUP_FILE property or variable is set.
   */
  for (auto& sg : groupFilesList) {
    std::ostream* fout;
    bool useProjectFile =
      cmIsOn(this->GeneratorTarget->GetProperty("GHS_NO_SOURCE_GROUP_FILE")) ||
      this->Makefile->IsOn("CMAKE_GHS_NO_SOURCE_GROUP_FILE");
    if (useProjectFile || sg.empty()) {
      fout = &fout_proj;
    } else {
      // Open the filestream in copy-if-different mode.
      std::string gname = sg;
      cmsys::SystemTools::ReplaceString(gname, "\\", "_");
      std::string lpath =
        cmStrCat(gname, cmGlobalGhsMultiGenerator::FILE_EXTENSION);
      std::string fpath = cmStrCat(
        this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
        this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget), '/',
        lpath);
      cmGeneratedFileStream* f = new cmGeneratedFileStream(fpath);
      f->SetCopyIfDifferent(true);
      gfiles.push_back(f);
      fout = f;
      this->GetGlobalGenerator()->WriteFileHeader(*f);
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, *f);
      fout_proj << lpath << " ";
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, fout_proj);
    }

    if (useProjectFile) {
      if (sg.empty()) {
        *fout << "{comment} Others" << '\n';
      } else {
        *fout << "{comment} " << sg << '\n';
      }
    } else if (sg.empty()) {
      *fout << "{comment} Others\n";
    }

    if (sg != "CMake Rules") {
      /* output rule for each source file */
      for (const cmSourceFile* si : groupFiles[sg]) {
        bool compile = true;
        // Convert filename to native system
        // WORKAROUND: GHS MULTI 6.1.4 and 6.1.6 are known to need backslash on
        // windows when opening some files from the search window.
        std::string fname(si->GetFullPath());
        cmSystemTools::ConvertToOutputSlashes(fname);

        /* For custom targets list any associated sources,
         * comment out source code to prevent it from being
         * compiled when processing this target.
         * Otherwise, comment out any custom command (main) dependencies that
         * are listed as source files to prevent them from being considered
         * part of the build.
         */
        std::string comment;
        if ((this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
             !si->GetLanguage().empty()) ||
            si->GetCustomCommand()) {
          comment = "{comment} ";
          compile = false;
        }

        *fout << comment << fname << WriteObjectLangOverride(si) << '\n';
        if (compile) {
          this->WriteSourceProperty(*fout, si, "INCLUDE_DIRECTORIES", "-I");
          this->WriteSourceProperty(*fout, si, "COMPILE_DEFINITIONS", "-D");
          this->WriteSourceProperty(*fout, si, "COMPILE_OPTIONS", "");

          /* to avoid clutter in the GUI only print out the objectName if it
           * has been renamed */
          std::string objectName = this->GeneratorTarget->GetObjectName(si);
          if (!objectName.empty() &&
              this->GeneratorTarget->HasExplicitObjectName(si)) {
            *fout << "    -o " << objectName << '\n';
          }
        }
      }
    } else {
      std::vector<cmSourceFile const*> customCommands;
      if (this->ComputeCustomCommandOrder(customCommands)) {
        std::string message = "The custom commands for target [" +
          this->GeneratorTarget->GetName() + "] had a cycle.\n";
        cmSystemTools::Error(message);
      } else {
        /* Custom targets do not have a dependency on SOURCES files.
         * Therefore the dependency list may include SOURCES files after the
         * custom target. Because nothing can depend on the custom target just
         * move it to the last item.
         */
        for (auto sf = customCommands.begin(); sf != customCommands.end();
             ++sf) {
          if (((*sf)->GetLocation()).GetName() == this->Name + ".rule") {
            std::rotate(sf, sf + 1, customCommands.end());
            break;
          }
        }
        int cmdcount = 0;
#ifdef _WIN32
        std::string fext = ".bat";
#else
        std::string fext = ".sh";
#endif
        for (auto& sf : customCommands) {
          const cmCustomCommand* cc = sf->GetCustomCommand();
          cmCustomCommandGenerator ccg(*cc, this->ConfigName,
                                       this->LocalGenerator);

          // Open the filestream for this custom command
          std::string fname = cmStrCat(
            this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
            this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
            '/', this->Name, "_cc", cmdcount++, '_',
            (sf->GetLocation()).GetName(), fext);

          cmGeneratedFileStream f(fname);
          f.SetCopyIfDifferent(true);
          this->WriteCustomCommandsHelper(f, ccg);
          f.Close();
          this->WriteCustomCommandLine(*fout, fname, ccg);
        }
      }
      if (this->TagType == GhsMultiGpj::CUSTOM_TARGET) {
        this->WriteBuildEvents(*fout);
      }
    }
  }

  for (cmGeneratedFileStream* f : gfiles) {
    f->Close();
  }
}